

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  reference pvVar2;
  WINDOW *local_5f0;
  value_type local_5c8;
  allocator local_5b9;
  string local_5b8 [32];
  undefined1 local_598 [8];
  visualOutput vOu;
  value_type local_528;
  allocator local_519;
  string local_518 [32];
  undefined1 local_4f8 [8];
  consoleInput cIn;
  allocator local_459;
  string local_458 [32];
  undefined1 local_438 [8];
  consoleOutput cOut;
  vector<int,_std::allocator<int>_> local_3e8;
  allocator local_3c9;
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  listOutput lOut;
  undefined1 local_318 [4];
  int i_1;
  vector<int,_std::allocator<int>_> outNums;
  vector<int,_std::allocator<int>_> local_2f8;
  allocator local_2d9;
  string local_2d8 [32];
  undefined1 local_2b8 [8];
  listInput lIn;
  undefined1 local_248 [4];
  int i;
  vector<int,_std::allocator<int>_> inNums;
  undefined1 local_220 [8];
  ifstream file;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220);
  signal(0x1c,redrawSystem);
  if (1 < argc) {
    std::ifstream::open(local_220,argv[1],8);
  }
  setlocale(6,"");
  initscr();
  start_color();
  noecho();
  cbreak();
  mousemask(0xfffffff,0);
  keypad(_stdscr,1);
  init_pair(1,0,7);
  init_pair(2,0);
  init_pair(3,0,1);
  init_pair(4,0,3);
  init_pair(5,7,0);
  init_color(8,0xfa,0xfa);
  init_color(9,500,500);
  init_pair(6,7,0);
  init_pair(7,7,8);
  init_pair(8,7,9);
  init_pair(9,7);
  init_pair(10,7,1);
  setCursor(false);
  refresh();
  initSystem(2,2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_248);
  for (lIn.highlight._4_4_ = 0; lIn.highlight._4_4_ < 0x14;
      lIn.highlight._4_4_ = lIn.highlight._4_4_ + 1) {
    iVar1 = rand();
    lIn.highlight._0_4_ = iVar1 + 100 + (iVar1 / 500) * -500;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_248,(value_type_conflict *)&lIn.highlight)
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"IN.A",&local_2d9);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_2f8,(vector<int,_std::allocator<int>_> *)local_248);
  listInput::listInput((listInput *)local_2b8,0x80,1,(string *)local_2d8,0x14,&local_2f8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2f8);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  listInput::initArrow((listInput *)local_2b8,'\0','\0');
  outNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_2b8;
  std::vector<input_*,_std::allocator<input_*>_>::push_back
            (&inputs,(value_type *)
                     &outNums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_318);
  for (lOut.highlight._4_4_ = 0; lOut.highlight._4_4_ < 0x14;
      lOut.highlight._4_4_ = lOut.highlight._4_4_ + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_248,(long)lOut.highlight._4_4_);
    lOut.highlight._0_4_ = *pvVar2 % 10;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_318,(value_type_conflict *)&lOut.highlight
              );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"OU.A",&local_3c9);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_3e8,(vector<int,_std::allocator<int>_> *)local_318);
  listOutput::listOutput((listOutput *)local_3a8,0x80,0x19,(string *)local_3c8,0x14,&local_3e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3e8);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  listOutput::initArrow((listOutput *)local_3a8,'\x0f','\x02');
  cOut.outWin = (WINDOW *)local_3a8;
  std::vector<output_*,_std::allocator<output_*>_>::push_back(&outputs,(value_type *)&cOut.outWin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"OU.B",&local_459);
  consoleOutput::consoleOutput((consoleOutput *)local_438,0x91,0x19,(string *)local_458,0x14);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  consoleOutput::initArrow((consoleOutput *)local_438,'\x0e','\x02');
  cIn.inWin = (WINDOW *)local_438;
  std::vector<output_*,_std::allocator<output_*>_>::push_back(&outputs,(value_type *)&cIn.inWin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"IN.B",&local_519);
  consoleInput::consoleInput((consoleInput *)local_4f8,0x91,1,(string *)local_518,0x12);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  consoleInput::initArrow((consoleInput *)local_4f8,'\x01','\0');
  local_528 = (value_type)local_4f8;
  std::vector<input_*,_std::allocator<input_*>_>::push_back(&inputs,&local_528);
  local_5f0 = (WINDOW *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x4f8) {
    local_5f0 = (WINDOW *)&cIn.super_input.field_0x28;
  }
  vOu.highlight = local_5f0;
  std::vector<runtimeInput_*,_std::allocator<runtimeInput_*>_>::push_back
            (&runtimeInputs,(value_type *)&vOu.highlight);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"OU.C",&local_5b9);
  visualOutput::visualOutput((visualOutput *)local_598,0x9b,0x19,(string *)local_5b8,0x24,0x16);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  visualOutput::initArrow((visualOutput *)local_598,'\r','\x02');
  local_5c8 = (value_type)local_598;
  std::vector<output_*,_std::allocator<output_*>_>::push_back(&outputs,&local_5c8);
  state = 1;
  endwin();
  while (state != 0) {
    if (state == 1) {
      redrawContent();
      editLoop();
    }
    else if (state == 2) {
      runtimeLoop();
    }
    else {
      state = 1;
    }
  }
  endwin();
  visualOutput::~visualOutput((visualOutput *)local_598);
  consoleInput::~consoleInput((consoleInput *)local_4f8);
  consoleOutput::~consoleOutput((consoleOutput *)local_438);
  listOutput::~listOutput((listOutput *)local_3a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_318);
  listInput::~listInput((listInput *)local_2b8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_248);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
  std::ifstream file;

  
  signal(SIGWINCH, redrawSystem);

  if(argc>=2)
    file.open(argv[1]);
  
  setlocale(LC_ALL, "");
  initscr();
  start_color();
  
  noecho();
  cbreak();
  mousemask(ALL_MOUSE_EVENTS, NULL);
	keypad(stdscr, TRUE);

  init_pair(1, COLOR_BLACK, COLOR_WHITE);
  init_pair(2, COLOR_BLACK, COLOR_GREEN);
  init_pair(3, COLOR_BLACK, COLOR_RED);
  init_pair(4, COLOR_BLACK, COLOR_YELLOW);
  init_pair(5, COLOR_WHITE, COLOR_BLACK);

  init_color(COLOR_DARK_GREY, 250, 250, 250);
  init_color(COLOR_BRIGHT_GREY, 500, 500, 500);

  init_pair(6, COLOR_WHITE, COLOR_BLACK);
  init_pair(7, COLOR_WHITE, COLOR_DARK_GREY);
  init_pair(8, COLOR_WHITE, COLOR_BRIGHT_GREY);
  init_pair(9, COLOR_WHITE, COLOR_WHITE);
  init_pair(10, COLOR_WHITE, COLOR_RED);

  setCursor(false);

  refresh();

  initSystem(2, 2);
  
  
  // TEST INPUTS AND OUTPUTS
  
  vector<int> inNums;
  for (int i = 0; i < 20; i++) {
    inNums.push_back((rand() % 500) + 100);
  }
	
  listInput lIn = listInput(128, 1, "IN.A", 20, inNums);
  lIn.initArrow(0, 0);
  inputs.push_back(&lIn);
  
  vector<int> outNums;
  for (int i = 0; i < 20; i++) {
    outNums.push_back(inNums[i] % 10);
  }
  
  listOutput lOut = listOutput(128, 25, "OU.A", 20, outNums);
  lOut.initArrow(15, 2);
  outputs.push_back(&lOut);
  
  consoleOutput cOut = consoleOutput(145, 25, "OU.B", 20);
  cOut.initArrow(14, 2);
  outputs.push_back(&cOut);
  
  consoleInput cIn = consoleInput(145, 1, "IN.B", 18);
  cIn.initArrow(1, 0);
  inputs.push_back(&cIn);
  runtimeInputs.push_back(&cIn);

  visualOutput vOu = visualOutput(155, 25, "OU.C", 36, 22);
  vOu.initArrow(13, 2);
  outputs.push_back(&vOu);
	  
  state = EDIT;

  endwin();
  while (state != OFF) {
  	switch(state) {
  		case EDIT:
  			redrawContent();
  			editLoop();
  			break;
  		case RUNNING:
  			runtimeLoop();
  			break;
  		default:
  			state = EDIT;
  	}
  }

  endwin();
  return 0;
}